

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sastoken.c
# Opt level: O3

STRING_HANDLE SASToken_CreateString(char *key,char *scope,char *keyName,uint64_t expiry)

{
  LOGGER_LOG p_Var1;
  STRING_HANDLE pSVar2;
  
  if (key == (char *)0x0 || scope == (char *)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/sastoken.c"
                ,"SASToken_CreateString",0x157,1,
                "Invalid Parameter to SASToken_Create. handle key: %p, handle scope: %p, handle keyName: %p"
                ,key,scope,keyName);
    }
    return (STRING_HANDLE)0x0;
  }
  pSVar2 = construct_sas_token(key,scope,keyName,expiry);
  return pSVar2;
}

Assistant:

STRING_HANDLE SASToken_CreateString(const char* key, const char* scope, const char* keyName, uint64_t expiry)
{
    STRING_HANDLE result;

    /*Codes_SRS_SASTOKEN_06_001: [If key is NULL then SASToken_Create shall return NULL.]*/
    /*Codes_SRS_SASTOKEN_06_003: [If scope is NULL then SASToken_Create shall return NULL.]*/
    /*Codes_SRS_SASTOKEN_06_007: [keyName is optional and can be set to NULL.]*/
    if ((key == NULL) ||
        (scope == NULL))
    {
        LogError("Invalid Parameter to SASToken_Create. handle key: %p, handle scope: %p, handle keyName: %p", key, scope, keyName);
        result = NULL;
    }
    else
    {
        result = construct_sas_token(key, scope, keyName, expiry);
    }
    return result;
}